

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O2

bool __thiscall
bssl::tls13_derive_session_psk
          (bssl *this,SSL_SESSION *session,Span<const_unsigned_char> nonce,bool is_dtls)

{
  bssl bVar1;
  string_view label;
  Span<const_unsigned_char> hash;
  bool bVar2;
  int iVar3;
  EVP_MD *md;
  undefined4 extraout_var;
  Span<const_unsigned_char> secret;
  Span<unsigned_char> out;
  
  md = (EVP_MD *)ssl_session_get_digest((SSL_SESSION *)this);
  bVar1 = this[0x4a];
  iVar3 = EVP_MD_size(md);
  if (CONCAT44(extraout_var,iVar3) == (ulong)(byte)bVar1) {
    label._M_str = "resumption";
    label._M_len = 10;
    hash.size_ = (size_t)nonce.data_;
    hash.data_ = (uchar *)session;
    secret.size_._0_1_ = this[0x4a];
    secret.data_ = (uchar *)(this + 10);
    secret.size_._1_7_ = 0;
    out.size_._0_1_ = this[0x4a];
    out.data_ = (uchar *)(this + 10);
    out.size_._1_7_ = 0;
    bVar2 = hkdf_expand_label(out,(EVP_MD *)md,secret,label,hash,nonce.size_._0_1_);
    return bVar2;
  }
  __assert_fail("session->secret.size() == EVP_MD_size(digest)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                ,0x1d2,
                "bool bssl::tls13_derive_session_psk(SSL_SESSION *, Span<const uint8_t>, bool)");
}

Assistant:

bool tls13_derive_session_psk(SSL_SESSION *session, Span<const uint8_t> nonce,
                              bool is_dtls) {
  const EVP_MD *digest = ssl_session_get_digest(session);
  // The session initially stores the resumption_master_secret, which we
  // override with the PSK.
  assert(session->secret.size() == EVP_MD_size(digest));
  return hkdf_expand_label(Span(session->secret), digest, session->secret,
                           kTLS13LabelResumptionPSK, nonce, is_dtls);
}